

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

ly_ht * lyht_new(uint32_t size,uint16_t val_size,lyht_value_equal_cb val_equal,void *cb_data,
                uint16_t resize)

{
  LY_ERR LVar1;
  ly_ht *ht;
  uint16_t resize_local;
  void *cb_data_local;
  lyht_value_equal_cb val_equal_local;
  uint16_t val_size_local;
  ly_ht *plStack_10;
  uint32_t size_local;
  
  if ((size == 0) || ((size & size - 1) != 0)) {
    __assert_fail("size && !(size & (size - 1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c"
                  ,0x5c,
                  "struct ly_ht *lyht_new(uint32_t, uint16_t, lyht_value_equal_cb, void *, uint16_t)"
                 );
  }
  if ((val_equal != (lyht_value_equal_cb)0x0) && (val_size != 0)) {
    if ((resize != 0) && (resize != 1)) {
      __assert_fail("resize == 0 || resize == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c"
                    ,0x5e,
                    "struct ly_ht *lyht_new(uint32_t, uint16_t, lyht_value_equal_cb, void *, uint16_t)"
                   );
    }
    val_equal_local._4_4_ = size;
    if (size < 8) {
      val_equal_local._4_4_ = 8;
    }
    plStack_10 = (ly_ht *)malloc(0x30);
    if (plStack_10 == (ly_ht *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyht_new");
      plStack_10 = (ly_ht *)0x0;
    }
    else {
      plStack_10->used = 0;
      plStack_10->size = val_equal_local._4_4_;
      plStack_10->val_equal = val_equal;
      plStack_10->cb_data = cb_data;
      plStack_10->resize = resize;
      plStack_10->rec_size = val_size + 8;
      LVar1 = lyht_init_hlists_and_records(plStack_10);
      if (LVar1 != LY_SUCCESS) {
        free(plStack_10);
        plStack_10 = (ly_ht *)0x0;
      }
    }
    return plStack_10;
  }
  __assert_fail("val_equal && val_size",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c"
                ,0x5d,
                "struct ly_ht *lyht_new(uint32_t, uint16_t, lyht_value_equal_cb, void *, uint16_t)")
  ;
}

Assistant:

ly_ht *
lyht_new(uint32_t size, uint16_t val_size, lyht_value_equal_cb val_equal, void *cb_data, uint16_t resize)
{
    struct ly_ht *ht;

    /* check that 2^x == size (power of 2) */
    assert(size && !(size & (size - 1)));
    assert(val_equal && val_size);
    assert(resize == 0 || resize == 1);

    if (size < LYHT_MIN_SIZE) {
        size = LYHT_MIN_SIZE;
    }

    ht = malloc(sizeof *ht);
    LY_CHECK_ERR_RET(!ht, LOGMEM(NULL), NULL);

    ht->used = 0;
    ht->size = size;
    ht->val_equal = val_equal;
    ht->cb_data = cb_data;
    ht->resize = resize;

    ht->rec_size = SIZEOF_LY_HT_REC + val_size;
    if (lyht_init_hlists_and_records(ht) != LY_SUCCESS) {
        free(ht);
        return NULL;
    }

    return ht;
}